

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void opj_j2k_setup_decoder(opj_j2k_t *j2k,opj_dparameters_t *parameters)

{
  opj_dparameters_t *parameters_local;
  opj_j2k_t *j2k_local;
  
  if ((j2k != (opj_j2k_t *)0x0) && (parameters != (opj_dparameters_t *)0x0)) {
    (j2k->m_cp).m_specific_param.m_dec.m_layer = parameters->cp_layer;
    (j2k->m_cp).m_specific_param.m_dec.m_reduce = parameters->cp_reduce;
  }
  return;
}

Assistant:

void opj_j2k_setup_decoder(opj_j2k_t *j2k, opj_dparameters_t *parameters)
{
        if(j2k && parameters) {
                j2k->m_cp.m_specific_param.m_dec.m_layer = parameters->cp_layer;
                j2k->m_cp.m_specific_param.m_dec.m_reduce = parameters->cp_reduce;

#ifdef USE_JPWL
                j2k->m_cp.correct = parameters->jpwl_correct;
                j2k->m_cp.exp_comps = parameters->jpwl_exp_comps;
                j2k->m_cp.max_tiles = parameters->jpwl_max_tiles;
#endif /* USE_JPWL */
        }
}